

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall despot::Parser::ParseHasTerminalTag(Parser *this,TiXmlHandle *xml_handle)

{
  bool bVar1;
  int iVar2;
  TiXmlElement *this_00;
  char *__s;
  log_ostream *plVar3;
  ostream *poVar4;
  TiXmlHandle local_60;
  string local_58;
  string local_38;
  
  util::tinyxml::TiXmlHandle::FirstChild(&local_60,(char *)xml_handle);
  util::tinyxml::TiXmlHandle::FirstChild((TiXmlHandle *)&local_38,(char *)&local_60);
  this_00 = util::tinyxml::TiXmlHandle::ToElement((TiXmlHandle *)&local_38);
  if (this_00 == (TiXmlElement *)0x0) {
    this->has_terminal_ = true;
  }
  else {
    __s = util::tinyxml::TiXmlElement::GetText(this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,__s,(allocator<char> *)&local_60);
    lower(&local_38,&local_58);
    bVar1 = std::operator==(&local_38,"true");
    this->has_terminal_ = bVar1;
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  iVar2 = logging::level();
  if (0 < iVar2) {
    iVar2 = logging::level();
    if (2 < iVar2) {
      plVar3 = logging::stream(3);
      poVar4 = std::operator<<(&plVar3->super_ostream,"HasTerminal = ");
      poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  return;
}

Assistant:

void Parser::ParseHasTerminalTag(TiXmlHandle& xml_handle) {
	TiXmlElement* e_HasTerminal = xml_handle.FirstChild("pomdpx").FirstChild(
		"HasTerminal").ToElement();
	if (e_HasTerminal != NULL) {
		has_terminal_ = (lower(e_HasTerminal->GetText()) == "true");
	} else {
		has_terminal_ = true;
	}
	logi << "HasTerminal = " << has_terminal_ << endl;
}